

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BuildEngineTest.cpp
# Opt level: O1

void __thiscall
anon_unknown.dwarf_a5c01::SimpleBuildEngineDelegate::cycleDetected
          (SimpleBuildEngineDelegate *this,
          vector<llbuild::core::Rule_*,_std::allocator<llbuild::core::Rule_*>_> *items)

{
  fwrite("error: cycle\n",0xd,1,_stderr);
  abort();
}

Assistant:

virtual void cycleDetected(const std::vector<core::Rule*>& items) override {
    cycle.clear();
    std::transform(items.begin(), items.end(), std::back_inserter(cycle),
                   [](auto rule) { return rule->key.str(); });
  }